

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<void_(ot::commissioner::Error)>::PerformDefaultAction
          (FunctionMocker<void_(ot::commissioner::Error)> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<void_(ot::commissioner::Error)> *this_00;
  Action<void_(ot::commissioner::Error)> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string message;
  Error local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<void_(ot::commissioner::Error)> *)0x0) {
    __return_storage_ptr__ = &local_38;
    std::operator+(__return_storage_ptr__,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
  }
  else {
    this_01 = OnCallSpec<void_(ot::commissioner::Error)>::GetAction(this_00);
    ot::commissioner::Error::Error(&local_60,(Error *)args);
    Action<void_(ot::commissioner::Error)>::Perform(this_01,(ArgumentTuple *)&local_60);
    __return_storage_ptr__ = &local_60.mMessage;
  }
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }